

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureFilteringTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles2::Functional::Texture2DFilteringCase::iterate(Texture2DFilteringCase *this)

{
  size_type *psVar1;
  pointer pfVar2;
  TextureFormat TVar3;
  deUint32 dVar4;
  TestLog *log;
  RenderContext *context;
  TestContext *testCtx;
  pointer pFVar5;
  undefined1 auVar6 [16];
  int iVar7;
  int iVar8;
  bool bVar9;
  int iVar10;
  deUint32 dVar11;
  SamplerType SVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined8 *puVar14;
  undefined4 extraout_var_01;
  NotSupportedError *this_00;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  void *data;
  pointer pFVar19;
  undefined1 auVar20 [16];
  vector<float,_std::allocator<float>_> texCoord;
  RandomViewport viewport;
  Surface rendered;
  PixelFormat pixelFormat;
  ulong local_318 [2];
  ConstPixelBufferAccess local_308;
  ScopedLogSection section;
  IVec4 colorBits;
  ulong local_2c8 [2];
  TextureFormat texFmt;
  LodPrecision local_2ac;
  Texture2DView local_2a0;
  undefined1 local_290 [76];
  _func_int **pp_Stack_244;
  int local_23c [2];
  float afStack_234 [2];
  float local_22c;
  undefined8 uStack_220;
  undefined8 local_218;
  LodMode local_210;
  undefined1 local_1f8 [8];
  _func_int **pp_Stack_1f0;
  int local_1e8 [2];
  float afStack_1e0 [2];
  float local_1d8;
  anon_union_16_3_1194ccdc_for_v local_1d4 [4];
  ios_base local_188 [8];
  ios_base local_180 [272];
  TextureFormatInfo fmtInfo;
  long lVar13;
  
  iVar10 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lVar13 = CONCAT44(extraout_var,iVar10);
  iVar10 = (*this->m_renderCtx->_vptr_RenderContext[4])();
  dVar11 = deStringHash((this->super_TestCase).super_TestNode.m_name._M_dataplus._M_p);
  uVar18 = ((uint)this->m_caseNdx >> 0x10 ^ this->m_caseNdx ^ 0x3d) * 9;
  uVar18 = (uVar18 >> 4 ^ uVar18) * 0x27d4eb2d;
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,(RenderTarget *)CONCAT44(extraout_var_00,iVar10),0x40,0x40,
             uVar18 >> 0xf ^ dVar11 ^ uVar18);
  texFmt = ((*(this->m_textures).
              super__Vector_base<glu::Texture2D_*,_std::allocator<glu::Texture2D_*>_>._M_impl.
              super__Vector_impl_data._M_start)->m_refTexture).super_TextureLevelPyramid.m_format;
  tcu::getTextureFormatInfo(&fmtInfo,&texFmt);
  pFVar19 = (this->m_cases).
            super__Vector_base<deqp::gles2::Functional::Texture2DFilteringCase::FilterCase,_std::allocator<deqp::gles2::Functional::Texture2DFilteringCase::FilterCase>_>
            ._M_impl.super__Vector_impl_data._M_start + this->m_caseNdx;
  log = ((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  TVar3 = (TextureFormat)(local_308.m_size.m_data + 2);
  local_308.m_format = TVar3;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"Test","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
  std::ostream::operator<<(local_1f8,this->m_caseNdx);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
  std::ios_base::~ios_base(local_188);
  uVar16 = 0xf;
  if (local_308.m_format != TVar3) {
    uVar16 = local_308._16_8_;
  }
  if (uVar16 < (ulong)((long)rendered.m_pixels.m_ptr + local_308.m_size.m_data._0_8_)) {
    uVar16 = 0xf;
    if ((size_t *)CONCAT44(rendered.m_height,rendered.m_width) != &rendered.m_pixels.m_cap) {
      uVar16 = rendered.m_pixels.m_cap;
    }
    if (uVar16 < (ulong)((long)rendered.m_pixels.m_ptr + local_308.m_size.m_data._0_8_))
    goto LAB_00f3c876;
    puVar14 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&rendered,0,(char *)0x0,(ulong)local_308.m_format);
  }
  else {
LAB_00f3c876:
    puVar14 = (undefined8 *)
              std::__cxx11::string::_M_append
                        ((char *)&local_308,(ulong)CONCAT44(rendered.m_height,rendered.m_width));
  }
  local_290._0_8_ = local_290 + 0x10;
  psVar1 = puVar14 + 2;
  if ((size_type *)*puVar14 == psVar1) {
    local_290._16_8_ = *psVar1;
    local_290._24_8_ = puVar14[3];
  }
  else {
    local_290._16_8_ = *psVar1;
    local_290._0_8_ = (size_type *)*puVar14;
  }
  local_290._8_8_ = puVar14[1];
  *puVar14 = psVar1;
  puVar14[1] = 0;
  *(undefined1 *)psVar1 = 0;
  pixelFormat._0_8_ = local_318;
  std::__cxx11::string::_M_construct<char_const*>((string *)&pixelFormat,"Test ","");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1f8);
  std::ostream::operator<<(local_1f8,this->m_caseNdx);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1f8);
  std::ios_base::~ios_base(local_188);
  uVar16 = CONCAT44(colorBits.m_data[3],colorBits.m_data[2]) + pixelFormat._8_8_;
  uVar17 = 0xf;
  if ((ulong *)pixelFormat._0_8_ != local_318) {
    uVar17 = local_318[0];
  }
  if (uVar17 < uVar16) {
    uVar17 = 0xf;
    if ((ulong *)CONCAT44(colorBits.m_data[1],colorBits.m_data[0]) != local_2c8) {
      uVar17 = local_2c8[0];
    }
    if (uVar16 <= uVar17) {
      puVar14 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&colorBits,0,(char *)0x0,pixelFormat._0_8_);
      goto LAB_00f3c9c8;
    }
  }
  puVar14 = (undefined8 *)
            std::__cxx11::string::_M_append
                      ((char *)&pixelFormat,CONCAT44(colorBits.m_data[1],colorBits.m_data[0]));
LAB_00f3c9c8:
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
  pfVar2 = (pointer)(puVar14 + 2);
  if ((pointer)*puVar14 == pfVar2) {
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = *(pointer *)pfVar2;
  }
  else {
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = *(pointer *)pfVar2;
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)*puVar14;
  }
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)puVar14[1];
  *puVar14 = pfVar2;
  puVar14[1] = 0;
  *(undefined1 *)pfVar2 = 0;
  tcu::ScopedLogSection::ScopedLogSection(&section,log,(string *)local_290,(string *)&texCoord);
  if ((pointer *)
      texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage) {
    operator_delete(texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage + 1);
  }
  if ((ulong *)CONCAT44(colorBits.m_data[1],colorBits.m_data[0]) != local_2c8) {
    operator_delete((ulong *)CONCAT44(colorBits.m_data[1],colorBits.m_data[0]),local_2c8[0] + 1);
  }
  if ((ulong *)pixelFormat._0_8_ != local_318) {
    operator_delete((void *)pixelFormat._0_8_,local_318[0] + 1);
  }
  if ((undefined1 *)local_290._0_8_ != local_290 + 0x10) {
    operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
  }
  if ((size_t *)CONCAT44(rendered.m_height,rendered.m_width) != &rendered.m_pixels.m_cap) {
    operator_delete((undefined1 *)CONCAT44(rendered.m_height,rendered.m_width),
                    rendered.m_pixels.m_cap + 1);
  }
  if (local_308.m_format != TVar3) {
    operator_delete((void *)local_308.m_format,local_308._16_8_ + 1);
  }
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)local_290,TEXTURETYPE_2D);
  tcu::Surface::Surface(&rendered,viewport.width,viewport.height);
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if ((0x3f < viewport.width) && (0x3f < viewport.height)) {
    glu::mapGLSampler((Sampler *)local_1f8,this->m_wrapS,this->m_wrapT,this->m_minFilter,
                      this->m_magFilter);
    local_22c = local_1d8;
    local_23c[0] = local_1e8[0];
    local_23c[1] = local_1e8[1];
    afStack_234[0] = afStack_1e0[0];
    afStack_234[1] = afStack_1e0[1];
    local_290._68_8_ = local_1f8;
    pp_Stack_244 = pp_Stack_1f0;
    uStack_220 = local_1d4[0]._8_8_;
    local_218 = local_1d4[1]._0_8_;
    SVar12 = glu::TextureTestUtil::getSamplerType(texFmt);
    local_290._4_4_ = SVar12;
    local_210 = LODMODE_EXACT;
    local_290._52_4_ = fmtInfo.lookupBias.m_data[0];
    local_290._56_4_ = fmtInfo.lookupBias.m_data[1];
    local_290._60_4_ = fmtInfo.lookupBias.m_data[2];
    local_290._64_4_ = fmtInfo.lookupBias.m_data[3];
    local_290._36_4_ = fmtInfo.lookupScale.m_data[0];
    local_290._40_4_ = fmtInfo.lookupScale.m_data[1];
    local_290._44_4_ = fmtInfo.lookupScale.m_data[2];
    local_290._48_4_ = fmtInfo.lookupScale.m_data[3];
    local_1f8 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&pp_Stack_1f0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&pp_Stack_1f0,"Texture coordinates: ",0x15);
    tcu::operator<<((ostream *)&pp_Stack_1f0,&pFVar19->minCoord);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pp_Stack_1f0," -> ",4);
    tcu::operator<<((ostream *)&pp_Stack_1f0,&pFVar19->maxCoord);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1f8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&pp_Stack_1f0);
    std::ios_base::~ios_base(local_180);
    glu::TextureTestUtil::computeQuadTexCoord2D(&texCoord,&pFVar19->minCoord,&pFVar19->maxCoord);
    (**(code **)(lVar13 + 0xb8))(0xde1,pFVar19->texture->m_glTexture);
    (**(code **)(lVar13 + 0x1360))(0xde1,0x2801,this->m_minFilter);
    (**(code **)(lVar13 + 0x1360))(0xde1,0x2800,this->m_magFilter);
    (**(code **)(lVar13 + 0x1360))(0xde1,0x2802,this->m_wrapS);
    (**(code **)(lVar13 + 0x1360))(0xde1,0x2803,this->m_wrapT);
    (**(code **)(lVar13 + 0x1a00))(viewport.x,viewport.y,viewport.width,viewport.height);
    deqp::gls::TextureTestUtil::TextureRenderer::renderQuad
              (&this->m_renderer,0,
               texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,(RenderParams *)local_290);
    context = this->m_renderCtx;
    local_308.m_format.order = RGBA;
    local_308.m_format.type = UNORM_INT8;
    data = (void *)rendered.m_pixels.m_cap;
    if (rendered.m_pixels.m_cap != 0) {
      data = rendered.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)local_1f8,&local_308.m_format,rendered.m_width,rendered.m_height
               ,1,data);
    glu::readPixels(context,viewport.x,viewport.y,(PixelBufferAccess *)local_1f8);
    dVar11 = this->m_minFilter;
    dVar4 = this->m_magFilter;
    iVar10 = (*this->m_renderCtx->_vptr_RenderContext[4])();
    uVar18 = (dVar4 == 0x2600 && dVar11 == 0x2600) | 0xfffffffe;
    pixelFormat._0_8_ = *(undefined8 *)(CONCAT44(extraout_var_01,iVar10) + 8);
    pixelFormat._8_8_ = *(undefined8 *)(CONCAT44(extraout_var_01,iVar10) + 0x10);
    iVar10 = pixelFormat.redBits;
    iVar15 = pixelFormat.greenBits;
    iVar7 = pixelFormat.blueBits;
    iVar8 = pixelFormat.alphaBits;
    colorBits.m_data[0] =
         -(uint)(0 < (int)(uVar18 + pixelFormat.redBits)) & uVar18 + pixelFormat.redBits;
    colorBits.m_data[1] =
         -(uint)(0 < (int)(uVar18 + pixelFormat.greenBits)) & uVar18 + pixelFormat.greenBits;
    colorBits.m_data[2] =
         -(uint)(0 < (int)(uVar18 + pixelFormat.blueBits)) & uVar18 + pixelFormat.blueBits;
    colorBits.m_data[3] =
         -(uint)(0 < (int)(uVar18 + pixelFormat.alphaBits)) & uVar18 + pixelFormat.alphaBits;
    local_2ac.rule = RULE_OPENGL;
    local_2ac.derivateBits = 7;
    local_1f8._0_4_ = DS|I;
    local_1f8._4_4_ = UNSIGNED_INT_11F_11F_10F_REV;
    pp_Stack_1f0 = (_func_int **)0x1000000016;
    local_1e8[0] = 0x10;
    local_1e8[1] = 0x10;
    local_2ac.lodBits = 4;
    tcu::computeFixedPointThreshold((tcu *)&local_308,&colorBits);
    auVar20._8_4_ = local_308.m_size.m_data[0];
    auVar20._12_4_ = local_308.m_size.m_data[1];
    auVar20._0_4_ = local_308.m_format.order;
    auVar20._4_4_ = local_308.m_format.type;
    auVar6._8_8_ = local_290._44_8_;
    auVar6._0_8_ = local_290._36_8_;
    auVar20 = divps(auVar20,auVar6);
    afStack_1e0 = auVar20._0_8_;
    local_1d8 = auVar20._8_4_;
    local_1d4[0].uData[0] = auVar20._12_4_;
    local_1f8._0_4_ = ARGB;
    local_1f8._4_4_ = UNORM_SHORT_555;
    pp_Stack_1f0 = (_func_int **)0x500000000;
    local_1e8[0] = 5;
    local_1e8[1] = 0;
    local_1d4[0]._4_4_ = CONCAT13(0 < iVar8,CONCAT12(0 < iVar7,CONCAT11(0 < iVar15,0 < iVar10)));
    testCtx = (this->super_TestCase).super_TestNode.m_testCtx;
    local_2a0.m_numLevels = 8;
    local_2a0._4_4_ = 3;
    if (rendered.m_pixels.m_cap != 0) {
      rendered.m_pixels.m_cap = (size_t)rendered.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&local_308,(TextureFormat *)&local_2a0,rendered.m_width,
               rendered.m_height,1,(void *)rendered.m_pixels.m_cap);
    local_2a0.m_levels = (pFVar19->texture->m_refTexture).m_view.m_levels;
    local_2a0.m_numLevels = (pFVar19->texture->m_refTexture).m_view.m_numLevels;
    bVar9 = glu::TextureTestUtil::verifyTextureResult
                      (testCtx,&local_308,&local_2a0,
                       texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start,(ReferenceParams *)local_290,
                       (LookupPrecision *)local_1f8,&local_2ac,&pixelFormat);
    if (!bVar9) {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
                 "Image verification failed");
    }
    iVar10 = this->m_caseNdx + 1;
    this->m_caseNdx = iVar10;
    pFVar19 = (this->m_cases).
              super__Vector_base<deqp::gles2::Functional::Texture2DFilteringCase::FilterCase,_std::allocator<deqp::gles2::Functional::Texture2DFilteringCase::FilterCase>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pFVar5 = (this->m_cases).
             super__Vector_base<deqp::gles2::Functional::Texture2DFilteringCase::FilterCase,_std::allocator<deqp::gles2::Functional::Texture2DFilteringCase::FilterCase>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    tcu::Surface::~Surface(&rendered);
    tcu::TestLog::endSection(section.m_log);
    iVar15 = (int)((ulong)((long)pFVar5 - (long)pFVar19) >> 3);
    return (IterateResult)
           (SBORROW4(iVar10,iVar15 * -0x55555555) != iVar10 + iVar15 * 0x55555555 < 0);
  }
  this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_00,"Too small viewport",::glcts::fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/functional/es2fTextureFilteringTests.cpp"
             ,0x113);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

Texture2DFilteringCase::IterateResult Texture2DFilteringCase::iterate (void)
{
	const glw::Functions&			gl			= m_renderCtx.getFunctions();
	const RandomViewport			viewport	(m_renderCtx.getRenderTarget(), VIEWPORT_WIDTH, VIEWPORT_HEIGHT, deStringHash(getName()) ^ deInt32Hash(m_caseNdx));
	const tcu::TextureFormat		texFmt		= m_textures[0]->getRefTexture().getFormat();
	const tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(texFmt);
	const FilterCase&				curCase		= m_cases[m_caseNdx];
	const tcu::ScopedLogSection		section		(m_testCtx.getLog(), string("Test") + de::toString(m_caseNdx), string("Test ") + de::toString(m_caseNdx));
	ReferenceParams					refParams	(TEXTURETYPE_2D);
	tcu::Surface					rendered	(viewport.width, viewport.height);
	vector<float>					texCoord;

	if (viewport.width < MIN_VIEWPORT_WIDTH || viewport.height < MIN_VIEWPORT_HEIGHT)
		throw tcu::NotSupportedError("Too small viewport", "", __FILE__, __LINE__);

	// Setup params for reference.
	refParams.sampler		= mapGLSampler(m_wrapS, m_wrapT, m_minFilter, m_magFilter);
	refParams.samplerType	= getSamplerType(texFmt);
	refParams.lodMode		= LODMODE_EXACT;
	refParams.colorBias		= fmtInfo.lookupBias;
	refParams.colorScale	= fmtInfo.lookupScale;

	// Compute texture coordinates.
	m_testCtx.getLog() << TestLog::Message << "Texture coordinates: " << curCase.minCoord << " -> " << curCase.maxCoord << TestLog::EndMessage;
	computeQuadTexCoord2D(texCoord, curCase.minCoord, curCase.maxCoord);

	gl.bindTexture	(GL_TEXTURE_2D, curCase.texture->getGLTexture());
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,	m_minFilter);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,	m_magFilter);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,		m_wrapS);
	gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,		m_wrapT);

	gl.viewport(viewport.x, viewport.y, viewport.width, viewport.height);
	m_renderer.renderQuad(0, &texCoord[0], refParams);
	glu::readPixels(m_renderCtx, viewport.x, viewport.y, rendered.getAccess());

	{
		const bool				isNearestOnly	= m_minFilter == GL_NEAREST && m_magFilter == GL_NEAREST;
		const tcu::PixelFormat	pixelFormat		= m_renderCtx.getRenderTarget().getPixelFormat();
		const tcu::IVec4		colorBits		= max(getBitsVec(pixelFormat) - (isNearestOnly ? 1 : 2), tcu::IVec4(0)); // 1 inaccurate bit if nearest only, 2 otherwise
		tcu::LodPrecision		lodPrecision	(tcu::LodPrecision::RULE_OPENGL);
		tcu::LookupPrecision	lookupPrecision;

		lodPrecision.derivateBits		= 7;
		lodPrecision.lodBits			= 4;
		lookupPrecision.colorThreshold	= tcu::computeFixedPointThreshold(colorBits) / refParams.colorScale;
		lookupPrecision.coordBits		= tcu::IVec3(9,9,0); // mediump interpolation
		lookupPrecision.uvwBits			= tcu::IVec3(5,5,0);
		lookupPrecision.colorMask		= getCompareMask(pixelFormat);

		const bool isOk = verifyTextureResult(m_testCtx, rendered.getAccess(), curCase.texture->getRefTexture(),
											  &texCoord[0], refParams, lookupPrecision, lodPrecision, pixelFormat);

		if (!isOk)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");
	}

	m_caseNdx += 1;
	return m_caseNdx < (int)m_cases.size() ? CONTINUE : STOP;
}